

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O3

int lws_add_http2_header_status(lws *wsi,uint code,uchar **p,uchar *end)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  uchar *name;
  uchar status [10];
  uchar local_2a [10];
  
  puVar1 = &(wsi->h2).field_0x11;
  *puVar1 = *puVar1 & 0xfb;
  iVar2 = sprintf((char *)local_2a,"%u",code);
  name = lws_token_to_string(WSI_TOKEN_HTTP_COLON_STATUS);
  if (name == (uchar *)0x0) {
    uVar3 = 1;
  }
  else {
    iVar2 = lws_add_http2_header_by_name(wsi,name,local_2a,iVar2,p,end);
    uVar3 = (uint)(iVar2 != 0);
  }
  return uVar3;
}

Assistant:

int lws_add_http2_header_status(struct lws *wsi, unsigned int code,
				unsigned char **p, unsigned char *end)
{
	unsigned char status[10];
	int n;

	wsi->h2.send_END_STREAM = 0; // !!(code >= 400);

	n = sprintf((char *)status, "%u", code);
	if (lws_add_http2_header_by_token(wsi, WSI_TOKEN_HTTP_COLON_STATUS,
					  status, n, p, end))

		return 1;

	return 0;
}